

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

bool tfs::subsample(Matrix *dstMatrix,Matrix *srcMatrix,unsigned_long da,unsigned_long db)

{
  unsigned_long uVar1;
  double *pdVar2;
  bool bVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long bb;
  unsigned_long bb_00;
  unsigned_long cc;
  unsigned_long bb_1;
  ulong bb_01;
  double *pdVar11;
  
  uVar1 = dstMatrix->m_a;
  if ((((uVar1 + da <= srcMatrix->m_a) && (uVar5 = dstMatrix->m_d, srcMatrix->m_d == uVar5)) &&
      (uVar8 = dstMatrix->m_c, uVar8 == srcMatrix->m_c)) &&
     (uVar4 = dstMatrix->m_b + db, uVar4 <= srcMatrix->m_b)) {
    pdVar2 = srcMatrix->m_data;
    pdVar11 = dstMatrix->m_data;
    if (uVar5 == 1) {
      if (uVar8 == 1) {
        for (; db < uVar4; db = db + 1) {
          uVar5 = TMatrix<double>::getIndex(srcMatrix,da,db);
          for (uVar8 = 0; uVar1 != uVar8; uVar8 = uVar8 + 1) {
            *pdVar11 = pdVar2[uVar5 + uVar8];
            pdVar11 = pdVar11 + 1;
          }
        }
      }
      else {
        for (uVar5 = 0; bb_01 = db, uVar5 != uVar8; uVar5 = uVar5 + 1) {
          for (; bb_01 < uVar4; bb_01 = bb_01 + 1) {
            uVar7 = TMatrix<double>::getIndex(srcMatrix,da,bb_01,uVar5);
            for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
              *pdVar11 = pdVar2[uVar7 + uVar10];
              pdVar11 = pdVar11 + 1;
            }
          }
        }
      }
    }
    else {
      for (uVar7 = 0; uVar7 != uVar5; uVar7 = uVar7 + 1) {
        for (uVar10 = 0; bb_00 = db, uVar10 != uVar8; uVar10 = uVar10 + 1) {
          for (; bb_00 < uVar4; bb_00 = bb_00 + 1) {
            uVar6 = TMatrix<double>::getIndex(srcMatrix,da,bb_00,uVar10,uVar7);
            for (uVar9 = 0; uVar1 != uVar9; uVar9 = uVar9 + 1) {
              *pdVar11 = pdVar2[uVar6 + uVar9];
              pdVar11 = pdVar11 + 1;
            }
          }
        }
      }
    }
    return true;
  }
  bVar3 = report_problem("Error",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/src/Matrix.cpp"
                         ,"subsample",0x7c,"Matricies not compatible for subsample.");
  return bVar3;
}

Assistant:

Matrix*
    kernelOperation( const Matrix &src, const Matrix &kernel, const unsigned long stride ) {
        // ---------------------------------------------------------------------------------
        // This is a zero pad reducing kernel function. Useful for sub-sampling
        // ---------------------------------------------------------------------------------
        const unsigned long srcX      = src.width();      // X
        const unsigned long srcY      = src.height();     // Y
        const unsigned long srcZ      = src.cc();         // r,g,b channel (if image)
        const unsigned long kernelX   = kernel.aa();
        const unsigned long kernelY   = kernel.bb();
        const DNN_NUMERIC *kernelData = kernel.dataReadOnly();
        
        if( srcX < kernelX || srcY < kernelY ) {
            log_error( "Source matrix smaller than kernel" );
            return 0;
        }
        if( stride < 1 ) {
            log_error( "Stride too small" );
            return 0;
        }
        const unsigned long dstX = (unsigned long) floor((srcX - kernelX) / stride + 1.0 );
        const unsigned long dstY = (unsigned long) floor((srcY - kernelY) / stride + 1.0 );
        const unsigned long dstZ = srcZ;
        Matrix      *dst = new Matrix( dstX, dstY, dstZ );
        DNN_NUMERIC *ptr = dst->data();
        for( unsigned long dz = 0; dz < dstZ; dz++ ) {
            for( unsigned long dy = 0; dy < dstY; dy++ ) {
                const unsigned long sy = dy * stride;
                for( unsigned long dx = 0; dx < dstX; dx++ ) {
                    const unsigned long sx = dx * stride;
                    const DNN_NUMERIC *kernelPtr = kernelData;
                    DNN_NUMERIC sum = 0.0;
                    for( unsigned long iy = sy; iy < (kernelY + sy); iy++ ) {
                        for( unsigned long ix = sx; ix < (kernelX + sx); ix++ ) {
                            const DNN_NUMERIC sourceValue = src.get( ix, iy, dz ); 
                            sum += sourceValue * *kernelPtr++;
                        }
                    }
                    *ptr++ = sum;       //  dst->set( dx, dy, dz, sum );
                }
            }
        }
        return dst;
    }